

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<2>::move_backward
          (InnerLeaf<2> *this,int *first,int *last)

{
  HighsHashTableEntry<int,_HighsImplications::VarBound> *__n;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *__x;
  reference __dest;
  reference __src;
  int *in_RDX;
  int *in_RSI;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *in_RDI;
  difference_type in_stack_ffffffffffffffc8;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *in_stack_ffffffffffffffd0;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *in_stack_ffffffffffffffe0;
  
  std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL>::begin
            ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL> *)0x5fe419);
  __n = std::next<HighsHashTableEntry<int,HighsImplications::VarBound>*>
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL>::begin
            ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL> *)0x5fe43e);
  __x = std::next<HighsHashTableEntry<int,HighsImplications::VarBound>*>
                  (in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL>::begin
            ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_22UL> *)0x5fe464);
  std::next<HighsHashTableEntry<int,HighsImplications::VarBound>*>(__x,(difference_type)__n);
  std::
  move_backward<HighsHashTableEntry<int,HighsImplications::VarBound>*,HighsHashTableEntry<int,HighsImplications::VarBound>*>
            (in_stack_ffffffffffffffe0,in_RDI,__x);
  __dest = std::array<unsigned_long,_23UL>::operator[]
                     ((array<unsigned_long,_23UL> *)__x,(size_type)__n);
  __src = std::array<unsigned_long,_23UL>::operator[]
                    ((array<unsigned_long,_23UL> *)__x,(size_type)__n);
  memmove(__dest,__src,(long)(*in_RDX - *in_RSI) << 3);
  return;
}

Assistant:

void move_backward(const int& first, const int& last) {
      // move elements backwards
      std::move_backward(std::next(entries.begin(), first),
                         std::next(entries.begin(), last),
                         std::next(entries.begin(), last + 1));
      memmove(&hashes[first + 1], &hashes[first],
              sizeof(hashes[0]) * (last - first));
    }